

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall gl4cts::AdvancedUsageTBO::Setup(AdvancedUsageTBO *this)

{
  AdvancedUsageTBO *this_local;
  
  this->counter_buffer_ = 0;
  this->buffer_ = 0;
  this->texture_ = 0;
  this->vbo_ = 0;
  this->vao_ = 0;
  this->prog_ = 0;
  this->rt_ = 0;
  this->fbo_ = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		counter_buffer_ = 0;
		buffer_			= 0;
		texture_		= 0;
		vao_ = vbo_ = 0;
		prog_		= 0;
		fbo_ = rt_ = 0;
		return NO_ERROR;
	}